

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestRegistry::registerTest(TestRegistry *this,TestCase *testCase)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream local_2f0 [8];
  ostringstream oss;
  TestCase local_178;
  undefined1 local_60 [8];
  string name;
  
  std::__cxx11::string::string((string *)local_60,(string *)testCase);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60,"");
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2f0);
    poVar2 = std::operator<<((ostream *)local_2f0,"Anonymous test case ");
    this->m_unnamedCount = this->m_unnamedCount + 1;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__cxx11::stringbuf::str();
    TestCase::withName(&local_178,testCase,(string *)((long)&name.field_2 + 8));
    (*(this->super_ITestCaseRegistry)._vptr_ITestCaseRegistry[4])(this,&local_178);
    TestCase::~TestCase(&local_178);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_2f0);
  }
  else {
    std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
              (&this->m_functions,testCase);
  }
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

virtual void registerTest( TestCase const& testCase ) {
            std::string name = testCase.getTestCaseInfo().name;
            if( name == "" ) {
                std::ostringstream oss;
                oss << "Anonymous test case " << ++m_unnamedCount;
                return registerTest( testCase.withName( oss.str() ) );
            }
            m_functions.push_back( testCase );
        }